

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLExport.cpp
# Opt level: O3

bool __thiscall
ODDLParser::OpenDDLExport::exportContext(OpenDDLExport *this,Context *ctx,string *filename)

{
  DDLNode *node;
  int iVar1;
  
  if (ctx != (Context *)0x0) {
    node = ctx->m_root;
    if (node == (DDLNode *)0x0) {
      return true;
    }
    if ((filename->_M_string_length == 0) ||
       (iVar1 = (*this->m_stream->_vptr_IOStreamBase[2])(this->m_stream,filename),
       (char)iVar1 != '\0')) {
      handleNode(this,node);
      return true;
    }
  }
  return false;
}

Assistant:

bool OpenDDLExport::exportContext( Context *ctx, const std::string &filename ) {
    if( ddl_nullptr == ctx ) {
        return false;
    }

    DDLNode *root( ctx->m_root );
    if ( ddl_nullptr == root ) {
        return true;
    }

    if (!filename.empty()) {
        if (!m_stream->open( filename )) {
            return false;
        }
    }

    const bool retValue( handleNode( root ) );
    
    return retValue;
}